

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O0

IterateResult __thiscall dit::anon_unknown_0::CaseListParserCase::iterate(CaseListParserCase *this)

{
  PtrData<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> data;
  bool bVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  TestError *this_01;
  Archive *archive;
  CaseListFilter *pCVar3;
  char *description;
  MovePtr *this_02;
  CaseListFilter *in_stack_fffffffffffff888;
  undefined8 in_stack_fffffffffffff890;
  MessageBuilder local_6e8;
  MessageBuilder local_568;
  char *local_3e8;
  MessageBuilder local_3e0;
  undefined1 local_25a;
  byte local_259;
  bool matchCase;
  MatchCase *pMStack_258;
  bool matchGroup;
  MatchCase *curCase;
  undefined1 local_248 [4];
  int subCaseNdx;
  PtrData<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *local_238;
  char *local_228;
  char *argv [3];
  int local_90;
  int numPass;
  undefined1 local_80 [8];
  MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> caseListFilter;
  CommandLine cmdLine;
  TestLog *log;
  CaseListParserCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::CommandLine::CommandLine
            ((CommandLine *)
             &caseListFilter.
              super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>.m_data
              .field_0x8);
  de::details::MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::MovePtr
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_80);
  local_90 = 0;
  tcu::TestLog::operator<<
            ((MessageBuilder *)(argv + 2),this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<((MessageBuilder *)(argv + 2),(char (*) [9])"Input:\n\"");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&this->m_caseList);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x372381);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(argv + 2));
  local_228 = "deqp";
  argv[0] = "--deqp-caselist";
  argv[1] = this->m_caseList;
  bVar1 = tcu::CommandLine::parse
                    ((CommandLine *)
                     &caseListFilter.
                      super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>
                      .m_data.field_0x8,3,&local_228);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Failed to parse command line",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/internal/ditFrameworkTests.cpp"
               ,0x66);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  archive = tcu::TestContext::getArchive((this->super_TestCase).super_TestNode.m_testCtx);
  this_02 = (MovePtr *)
            &caseListFilter.
             super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>.m_data.
             field_0x8;
  tcu::CommandLine::createCaseListFilter
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_248,
             (CommandLine *)this_02,archive);
  local_238 = de::details::MovePtr::operator_cast_to_PtrData
                        ((PtrData<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)
                         local_248,this_02);
  data._8_8_ = in_stack_fffffffffffff890;
  data.ptr = in_stack_fffffffffffff888;
  de::details::MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::operator=
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_80,data
            );
  de::details::MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::~MovePtr
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_248);
  for (curCase._4_4_ = 0; curCase._4_4_ < this->m_numSubCases; curCase._4_4_ = curCase._4_4_ + 1) {
    pMStack_258 = this->m_subCases + curCase._4_4_;
    tcu::TestLog::operator<<(&local_3e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_3e0,(char (*) [11])"Checking \"");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&pMStack_258->path);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x372381);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])", expecting ");
    local_3e8 = getMatchCaseExpectedDesc(pMStack_258->expected);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_3e8);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3e0);
    pCVar3 = de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>
             ::operator->((UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>
                           *)local_80);
    local_259 = tcu::CaseListFilter::checkTestGroupName(pCVar3,pMStack_258->path);
    pCVar3 = de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>
             ::operator->((UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>
                           *)local_80);
    local_25a = tcu::CaseListFilter::checkTestCaseName(pCVar3,pMStack_258->path);
    if (((bool)(local_259 & 1) == (pMStack_258->expected == MATCH_GROUP)) &&
       ((bool)local_25a == (pMStack_258->expected == MATCH_CASE))) {
      tcu::TestLog::operator<<(&local_568,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<(&local_568,(char (*) [8])"   pass");
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_568);
      local_90 = local_90 + 1;
    }
    else {
      tcu::TestLog::operator<<(&local_6e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<(&local_6e8,(char (*) [9])"   FAIL!");
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6e8);
    }
  }
  bVar1 = local_90 != this->m_numSubCases;
  description = "Unexpected match result";
  if (!bVar1) {
    description = "All passed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)bVar1,description);
  de::details::MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::~MovePtr
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_80);
  tcu::CommandLine::~CommandLine
            ((CommandLine *)
             &caseListFilter.
              super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>.m_data
              .field_0x8);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&							log		= m_testCtx.getLog();
		tcu::CommandLine					cmdLine;
		de::MovePtr<tcu::CaseListFilter>	caseListFilter;
		int									numPass	= 0;

		log << TestLog::Message << "Input:\n\"" << m_caseList << "\"" << TestLog::EndMessage;

		{
			const char* argv[] =
			{
				"deqp",
				"--deqp-caselist",
				m_caseList
			};

			if (!cmdLine.parse(DE_LENGTH_OF_ARRAY(argv), argv))
				TCU_FAIL("Failed to parse command line");
		}

		caseListFilter = cmdLine.createCaseListFilter(m_testCtx.getArchive());

		for (int subCaseNdx = 0; subCaseNdx < m_numSubCases; subCaseNdx++)
		{
			const MatchCase&	curCase		= m_subCases[subCaseNdx];
			bool				matchGroup;
			bool				matchCase;

			log << TestLog::Message << "Checking \"" << curCase.path << "\""
									<< ", expecting " << getMatchCaseExpectedDesc(curCase.expected)
				<< TestLog::EndMessage;

			matchGroup	= caseListFilter->checkTestGroupName(curCase.path);
			matchCase	= caseListFilter->checkTestCaseName(curCase.path);

			if ((matchGroup	== (curCase.expected == MatchCase::MATCH_GROUP)) &&
				(matchCase	== (curCase.expected == MatchCase::MATCH_CASE)))
			{
				log << TestLog::Message << "   pass" << TestLog::EndMessage;
				numPass += 1;
			}
			else
				log << TestLog::Message << "   FAIL!" << TestLog::EndMessage;
		}

		m_testCtx.setTestResult((numPass == m_numSubCases) ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								(numPass == m_numSubCases) ? "All passed"			: "Unexpected match result");

		return STOP;
	}